

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_chunk.c
# Opt level: O1

nng_err nni_http_chunks_parse(nni_http_chunks *cl,void *buf,size_t n,size_t *lenp)

{
  char cVar1;
  chunk_state cVar2;
  ulong __n;
  bool bVar3;
  bool bVar4;
  size_t *psVar5;
  void *pvVar6;
  size_t sVar7;
  ushort **ppuVar8;
  long lVar9;
  ulong uVar10;
  void *pvVar11;
  size_t *psVar12;
  int iVar13;
  ulong __n_00;
  ulong local_48;
  
  uVar10 = 0;
  psVar5 = &cl->cl_size;
  do {
    cVar2 = cl->cl_state;
    if ((cVar2 == CS_DONE) || (__n_00 = n - uVar10, n < uVar10 || __n_00 == 0)) {
      *lenp = uVar10;
      return (uint)(cVar2 != CS_DONE) << 3;
    }
    bVar3 = true;
    if (cVar2 == CS_DONE) {
      psVar12 = (size_t *)((ulong)psVar5 & 0xffffffff);
      goto LAB_00133bdb;
    }
    if (cVar2 == CS_DATA) {
      pvVar6 = nni_list_last(&cl->cl_chunks);
      if (pvVar6 == (void *)0x0) {
        nni_panic("%s: %d: assert err: %s",
                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/supplemental/http/http_chunk.c"
                  ,0x10d,"chunk != NULL");
      }
      if (cl->cl_state != CS_DATA) {
        nni_panic("%s: %d: assert err: %s",
                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/supplemental/http/http_chunk.c"
                  ,0x10e,"cl->cl_state == CS_DATA");
      }
      if (*(ulong *)((long)pvVar6 + 0x18) < *(ulong *)((long)pvVar6 + 0x20)) {
        nni_panic("%s: %d: assert err: %s",
                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/supplemental/http/http_chunk.c"
                  ,0x10f,"chunk->c_resid <= chunk->c_alloc");
      }
      if (*(ulong *)((long)pvVar6 + 0x18) < 3) {
        nni_panic("%s: %d: assert err: %s",
                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/supplemental/http/http_chunk.c"
                  ,0x110,"chunk->c_alloc > 2");
      }
      __n = *(ulong *)((long)pvVar6 + 0x20);
      pvVar11 = (void *)((*(long *)((long)pvVar6 + 0x18) - __n) + *(long *)((long)pvVar6 + 0x28));
      if (__n_00 < __n) {
        memcpy(pvVar11,(void *)((long)buf + uVar10),__n_00);
        *(long *)((long)pvVar6 + 0x20) = *(long *)((long)pvVar6 + 0x20) - __n_00;
        psVar12 = (size_t *)0x0;
        bVar3 = true;
        local_48 = __n_00;
      }
      else {
        memcpy(pvVar11,(void *)((long)buf + uVar10),__n);
        psVar12 = (size_t *)0xd;
        if (*(char *)(*(long *)((long)pvVar6 + 0x28) + *(long *)((long)pvVar6 + 0x10)) == '\r') {
          bVar3 = false;
          if (*(char *)(*(long *)((long)pvVar6 + 0x28) + 1 + *(long *)((long)pvVar6 + 0x10)) == '\n'
             ) {
            *(undefined8 *)((long)pvVar6 + 0x20) = 0;
            cl->cl_size = 0;
            cl->cl_line = 0;
            cl->cl_state = CS_INIT;
            bVar3 = true;
            psVar12 = (size_t *)0x0;
            local_48 = __n;
          }
        }
        else {
          bVar3 = false;
        }
      }
      if (bVar3) {
        uVar10 = uVar10 + local_48;
        psVar12 = (size_t *)((ulong)psVar5 & 0xffffffff);
      }
      goto LAB_00133bdb;
    }
    psVar12 = (size_t *)0xd;
    bVar4 = false;
    if (CS_TRLRCR < cVar2) goto switchD_00133939_caseD_4;
    cVar1 = *(char *)((long)buf + uVar10);
    iVar13 = (int)cVar1;
    lVar9 = (long)iVar13;
    switch(cVar2) {
    case CS_INIT:
      ppuVar8 = __ctype_b_loc();
      if (((*ppuVar8)[lVar9] & 8) != 0) {
        cl->cl_state = CS_LEN;
        goto switchD_00133939_caseD_1;
      }
LAB_00133950:
      bVar4 = false;
      break;
    case CS_LEN:
switchD_00133939_caseD_1:
      ppuVar8 = __ctype_b_loc();
      if ((*(byte *)((long)*ppuVar8 + lVar9 * 2 + 1) & 8) == 0) {
        if (5 < (byte)(cVar1 + 0xbfU)) {
          if ((byte)(cVar1 + 0x9fU) < 6) {
            cl->cl_size = (ulong)(iVar13 - 0x57) + cl->cl_size * 0x10;
          }
          else {
            bVar4 = false;
            if (cVar1 == '\r') {
              cl->cl_state = CS_CR;
              goto LAB_00133bf0;
            }
            if (cVar1 != ';') break;
            cl->cl_state = CS_EXT;
          }
          goto LAB_00133bc6;
        }
        cl->cl_size = (ulong)(iVar13 - 0x37) + cl->cl_size * 0x10;
        psVar12 = (size_t *)0x0;
        bVar4 = true;
      }
      else {
        cl->cl_size = (cl->cl_size * 0x10 + lVar9) - 0x30;
        psVar12 = (size_t *)0x0;
        bVar4 = true;
      }
      break;
    case CS_EXT:
      if (cVar1 == '\r') {
        cl->cl_state = CS_CR;
      }
      else {
        ppuVar8 = __ctype_b_loc();
        if ((*(byte *)((long)*ppuVar8 + lVar9 * 2 + 1) & 0x40) == 0) goto LAB_00133a7a;
      }
      goto LAB_00133bc6;
    case CS_CR:
      if (cVar1 == '\n') {
        if (cl->cl_size == 0) {
LAB_00133a81:
          cl->cl_line = 0;
          cl->cl_state = CS_TRLR;
          goto LAB_00133bc6;
        }
        if ((cl->cl_maxsz == 0) ||
           (sVar7 = nni_http_chunks_size(cl), sVar7 + cl->cl_size <= cl->cl_maxsz)) {
          pvVar6 = nni_zalloc(0x30);
          psVar12 = (size_t *)0x2;
          if (pvVar6 == (void *)0x0) goto LAB_00133950;
          pvVar11 = nni_alloc(cl->cl_size + 2);
          *(void **)((long)pvVar6 + 0x28) = pvVar11;
          if (pvVar11 == (void *)0x0) {
            nni_free(pvVar6,0x30);
          }
          else {
            cl->cl_state = CS_DATA;
            sVar7 = cl->cl_size;
            *(size_t *)((long)pvVar6 + 0x10) = sVar7;
            lVar9 = sVar7 + 2;
            *(long *)((long)pvVar6 + 0x18) = lVar9;
            *(long *)((long)pvVar6 + 0x20) = lVar9;
            nni_list_append(&cl->cl_chunks,pvVar6);
            psVar12 = (size_t *)0x0;
          }
          bVar4 = pvVar11 != (void *)0x0;
        }
        else {
          psVar12 = (size_t *)0x11;
          bVar4 = false;
        }
      }
      else {
LAB_00133a7a:
        bVar4 = false;
      }
      break;
    case CS_TRLR:
      if (cVar1 == '\r') {
        cl->cl_state = CS_TRLRCR;
        goto LAB_00133bc6;
      }
      ppuVar8 = __ctype_b_loc();
      bVar4 = false;
      if ((*(byte *)((long)*ppuVar8 + lVar9 * 2 + 1) & 0x40) == 0) break;
      cl->cl_line = cl->cl_line + 1;
LAB_00133bf0:
      bVar4 = true;
      psVar12 = (size_t *)0x0;
      break;
    case CS_TRLRCR:
      if (cVar1 != '\n') goto LAB_00133a7a;
      if (cl->cl_line != 0) goto LAB_00133a81;
      cl->cl_state = CS_DONE;
LAB_00133bc6:
      psVar12 = (size_t *)0x0;
      bVar4 = true;
    }
switchD_00133939_caseD_4:
    bVar3 = true;
    if (bVar4) {
      uVar10 = uVar10 + 1;
      psVar12 = (size_t *)((ulong)psVar5 & 0xffffffff);
    }
    else {
      bVar3 = false;
    }
LAB_00133bdb:
    psVar5 = psVar12;
    if (!bVar3) {
      return (nng_err)psVar5;
    }
  } while( true );
}

Assistant:

nng_err
nni_http_chunks_parse(nni_http_chunks *cl, void *buf, size_t n, size_t *lenp)
{
	size_t i   = 0;
	char  *src = buf;

	// Format of this data is <hexdigits> [ ; <ascii> CRLF ]
	// The <ascii> are chunk extensions, and we don't support any.

	while ((cl->cl_state != CS_DONE) && (i < n)) {
		int    rv;
		size_t cnt;
		switch (cl->cl_state) {
		case CS_DONE:
			// Completed parse!
			break;

		case CS_DATA:
			if ((rv = chunk_ingest_data(
			         cl, src + i, n - i, &cnt)) != 0) {
				return (rv);
			}
			i += cnt;
			break;

		default:
			// All others character by character parse through
			// the state machine grinder.
			if ((rv = chunk_ingest_char(cl, src[i])) != 0) {
				return (rv);
			}
			i++;
			break;
		}
	}

	*lenp = i;
	if (cl->cl_state != CS_DONE) {
		return (NNG_EAGAIN);
	}
	return (NNG_OK);
}